

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tiny_obj_loader.h
# Opt level: O3

bool __thiscall
tinyobj::MaterialFileReader::operator()
          (MaterialFileReader *this,string *matId,
          vector<tinyobj::material_t,_std::allocator<tinyobj::material_t>_> *materials,
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
          *matMap,string *warn,string *err)

{
  size_type *psVar1;
  pointer *__x;
  long lVar2;
  pointer pcVar3;
  istream *piVar4;
  long *plVar5;
  ostream *poVar6;
  long *plVar7;
  size_type *psVar8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  string *psVar9;
  ulong uVar10;
  long lVar11;
  bool bVar12;
  istringstream local_458 [8];
  istringstream f;
  ostream local_448 [104];
  ios_base local_3e0 [8];
  ios_base local_3d8 [264];
  long *local_2d0;
  stringstream ss;
  long local_2c0;
  long lStack_2b8;
  byte abStack_2b0 [96];
  ios_base local_250 [392];
  MaterialFileReader *local_c8;
  vector<tinyobj::material_t,_std::allocator<tinyobj::material_t>_> *local_c0;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  *local_b8;
  string *local_b0;
  undefined1 auStack_a8 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  paths;
  string s;
  string filepath;
  string filepath_1;
  
  local_c0 = materials;
  local_b8 = matMap;
  if ((this->m_mtlBaseDir)._M_string_length == 0) {
    pcVar3 = (matId->_M_dataplus)._M_p;
    psVar9 = warn;
    filepath.field_2._8_8_ = &filepath_1._M_string_length;
    std::__cxx11::string::_M_construct<char*>
              ((string *)((long)&filepath.field_2 + 8),pcVar3,pcVar3 + matId->_M_string_length);
    std::ifstream::ifstream(&local_2d0,(char *)filepath.field_2._8_8_,_S_in);
    bVar12 = (abStack_2b0[local_2d0[-3]] & 5) == 0;
    if (bVar12) {
      LoadMtl(local_b8,local_c0,(istream *)&local_2d0,warn,psVar9);
    }
    else {
      std::__cxx11::stringstream::stringstream((stringstream *)local_458);
      std::__ostream_insert<char,std::char_traits<char>>(local_448,"Material file [ ",0x10);
      poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                         (local_448,(char *)filepath.field_2._8_8_,(long)filepath_1._M_dataplus._M_p
                         );
      std::__ostream_insert<char,std::char_traits<char>>(poVar6," ] not found in a path : ",0x19);
      poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar6,(this->m_mtlBaseDir)._M_dataplus._M_p,
                          (this->m_mtlBaseDir)._M_string_length);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
      std::ostream::put((char)poVar6);
      std::ostream::flush();
      if (warn != (string *)0x0) {
        std::__cxx11::stringbuf::str();
        std::__cxx11::string::_M_append
                  ((char *)warn,
                   (ulong)paths.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage);
        if (paths.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage != (pointer)&s._M_string_length) {
          operator_delete(paths.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage,
                          CONCAT71(s._M_string_length._1_7_,(undefined1)s._M_string_length) + 1);
        }
      }
      std::__cxx11::stringstream::~stringstream((stringstream *)local_458);
      std::ios_base::~ios_base(local_3d8);
    }
    std::ifstream::~ifstream(&local_2d0);
    if ((size_type *)filepath.field_2._8_8_ != &filepath_1._M_string_length) {
      operator_delete((void *)filepath.field_2._8_8_,
                      CONCAT62(filepath_1._M_string_length._2_6_,
                               (undefined2)filepath_1._M_string_length) + 1);
    }
  }
  else {
    auStack_a8 = (undefined1  [8])0x0;
    paths.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    paths.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    psVar9 = warn;
    local_c8 = this;
    std::__cxx11::istringstream::istringstream(local_458,(string *)&this->m_mtlBaseDir,_S_in);
    paths.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)&s._M_string_length;
    s._M_dataplus._M_p = (pointer)0x0;
    s._M_string_length._0_1_ = 0;
    __x = &paths.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage;
    while( true ) {
      piVar4 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                         ((istream *)local_458,(string *)__x,':');
      if (((byte)piVar4[*(long *)(*(long *)piVar4 + -0x18) + 0x20] & 5) != 0) break;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)auStack_a8,(value_type *)__x);
    }
    local_b0 = warn;
    if ((undefined1  [8])
        paths.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start != auStack_a8) {
      psVar1 = &filepath._M_string_length;
      lVar11 = 0;
      uVar10 = 0;
      do {
        lVar2 = *(long *)((long)((long)auStack_a8 + 8) + lVar11);
        if (lVar2 == 0) {
          pcVar3 = (matId->_M_dataplus)._M_p;
          s.field_2._8_8_ = psVar1;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)((long)&s.field_2 + 8),pcVar3,pcVar3 + matId->_M_string_length);
        }
        else {
          __lhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  ((long)&((_Alloc_hider *)auStack_a8)->_M_p + lVar11);
          if ((__lhs->_M_dataplus)._M_p[lVar2 + -1] == '/') {
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           ((long)&s.field_2 + 8),__lhs,matId);
          }
          else {
            filepath.field_2._8_8_ = &filepath_1._M_string_length;
            filepath_1._M_string_length._0_2_ = 0x2f;
            filepath_1._M_dataplus._M_p = (pointer)0x1;
            psVar9 = (string *)__lhs->_M_string_length;
            plVar5 = (long *)std::__cxx11::string::replace
                                       ((ulong)((long)&filepath.field_2 + 8),0,(char *)0x0,
                                        (ulong)(__lhs->_M_dataplus)._M_p);
            local_2d0 = &local_2c0;
            plVar7 = plVar5 + 2;
            if ((long *)*plVar5 == plVar7) {
              local_2c0 = *plVar7;
              lStack_2b8 = plVar5[3];
            }
            else {
              local_2c0 = *plVar7;
              local_2d0 = (long *)*plVar5;
            }
            _ss = plVar5[1];
            *plVar5 = (long)plVar7;
            plVar5[1] = 0;
            *(undefined1 *)(plVar5 + 2) = 0;
            plVar5 = (long *)std::__cxx11::string::_M_append
                                       ((char *)&local_2d0,(ulong)(matId->_M_dataplus)._M_p);
            psVar8 = (size_type *)(plVar5 + 2);
            if ((size_type *)*plVar5 == psVar8) {
              filepath._M_string_length = *psVar8;
              filepath.field_2._M_allocated_capacity = plVar5[3];
              s.field_2._8_8_ = psVar1;
            }
            else {
              filepath._M_string_length = *psVar8;
              s.field_2._8_8_ = (size_type *)*plVar5;
            }
            filepath._M_dataplus._M_p = (pointer)plVar5[1];
            *plVar5 = (long)psVar8;
            plVar5[1] = 0;
            *(undefined1 *)(plVar5 + 2) = 0;
            if (local_2d0 != &local_2c0) {
              operator_delete(local_2d0,local_2c0 + 1);
            }
            if ((size_type *)filepath.field_2._8_8_ != &filepath_1._M_string_length) {
              operator_delete((void *)filepath.field_2._8_8_,
                              CONCAT62(filepath_1._M_string_length._2_6_,
                                       (undefined2)filepath_1._M_string_length) + 1);
            }
          }
        }
        std::ifstream::ifstream(&local_2d0,(char *)s.field_2._8_8_,_S_in);
        if ((abStack_2b0[local_2d0[-3]] & 5) == 0) {
          LoadMtl(local_b8,local_c0,(istream *)&local_2d0,local_b0,psVar9);
          std::ifstream::~ifstream(&local_2d0);
          if ((size_type *)s.field_2._8_8_ != psVar1) {
            operator_delete((void *)s.field_2._8_8_,filepath._M_string_length + 1);
          }
          bVar12 = true;
          goto LAB_001146e1;
        }
        std::ifstream::~ifstream(&local_2d0);
        if ((size_type *)s.field_2._8_8_ != psVar1) {
          operator_delete((void *)s.field_2._8_8_,filepath._M_string_length + 1);
        }
        uVar10 = uVar10 + 1;
        lVar11 = lVar11 + 0x20;
      } while (uVar10 < (ulong)((long)paths.
                                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start - (long)auStack_a8
                               >> 5));
    }
    std::__cxx11::stringstream::stringstream((stringstream *)&local_2d0);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_2c0,"Material file [ ",0x10);
    psVar9 = local_b0;
    poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&local_2c0,(matId->_M_dataplus)._M_p,matId->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6," ] not found in a path : ",0x19);
    poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar6,(local_c8->m_mtlBaseDir)._M_dataplus._M_p,
                        (local_c8->m_mtlBaseDir)._M_string_length);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
    std::ostream::put((char)poVar6);
    std::ostream::flush();
    if (psVar9 != (string *)0x0) {
      std::__cxx11::stringbuf::str();
      std::__cxx11::string::_M_append((char *)psVar9,filepath.field_2._8_8_);
      if ((size_type *)filepath.field_2._8_8_ != &filepath_1._M_string_length) {
        operator_delete((void *)filepath.field_2._8_8_,
                        CONCAT62(filepath_1._M_string_length._2_6_,
                                 (undefined2)filepath_1._M_string_length) + 1);
      }
    }
    std::__cxx11::stringstream::~stringstream((stringstream *)&local_2d0);
    std::ios_base::~ios_base(local_250);
    bVar12 = false;
LAB_001146e1:
    if (paths.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage != (pointer)&s._M_string_length) {
      operator_delete(paths.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage,
                      CONCAT71(s._M_string_length._1_7_,(undefined1)s._M_string_length) + 1);
    }
    std::__cxx11::istringstream::~istringstream(local_458);
    std::ios_base::~ios_base(local_3e0);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)auStack_a8);
  }
  return bVar12;
}

Assistant:

bool MaterialFileReader::operator()(const std::string &matId,
                                    std::vector<material_t> *materials,
                                    std::map<std::string, int> *matMap,
                                    std::string *warn, std::string *err) {
  if (!m_mtlBaseDir.empty()) {
#ifdef _WIN32
    char sep = ';';
#else
    char sep = ':';
#endif

    // https://stackoverflow.com/questions/5167625/splitting-a-c-stdstring-using-tokens-e-g
    std::vector<std::string> paths;
    std::istringstream f(m_mtlBaseDir);

    std::string s;
    while (getline(f, s, sep)) {
      paths.push_back(s);
    }

    for (size_t i = 0; i < paths.size(); i++) {
      std::string filepath = JoinPath(paths[i], matId);

      std::ifstream matIStream(filepath.c_str());
      if (matIStream) {
        LoadMtl(matMap, materials, &matIStream, warn, err);

        return true;
      }
    }

    std::stringstream ss;
    ss << "Material file [ " << matId
       << " ] not found in a path : " << m_mtlBaseDir << std::endl;
    if (warn) {
      (*warn) += ss.str();
    }
    return false;

  } else {
    std::string filepath = matId;
    std::ifstream matIStream(filepath.c_str());
    if (matIStream) {
      LoadMtl(matMap, materials, &matIStream, warn, err);

      return true;
    }

    std::stringstream ss;
    ss << "Material file [ " << filepath
       << " ] not found in a path : " << m_mtlBaseDir << std::endl;
    if (warn) {
      (*warn) += ss.str();
    }

    return false;
  }
}